

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void qtree_onebit(int *a,int n,int nx,int ny,uchar *b,int bit)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uchar *puVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  
  bVar1 = (byte)bit;
  uVar15 = 2 << (bVar1 & 0x1f);
  uVar7 = 4 << (bVar1 & 0x1f);
  uVar12 = 8 << (bVar1 & 0x1f);
  iVar2 = n * 2;
  iVar5 = 0;
  uVar11 = 0;
  iVar6 = 0;
  while( true ) {
    lVar3 = (long)iVar5;
    lVar16 = (long)(int)uVar11;
    if (nx + -1 <= iVar6) break;
    lVar4 = lVar3 << 0x20;
    lVar8 = (long)n;
    lVar9 = lVar8 << 0x20;
    lVar17 = lVar16 << 0x20;
    lVar13 = 0;
    for (iVar14 = 0; iVar14 < ny + -1; iVar14 = iVar14 + 2) {
      b[lVar13 + lVar16] =
           (uchar)((int)(a[lVar3 + lVar13 * 2] << 3 & uVar12 |
                         a[lVar3 + lVar13 * 2 + 1] << 2 & uVar7 |
                        a[lVar8 + lVar13 * 2] * 2 & uVar15 |
                        a[lVar8 + lVar13 * 2 + 1] & 1 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f));
      lVar4 = lVar4 + 0x200000000;
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0x200000000;
      lVar17 = lVar17 + 0x100000000;
    }
    if (iVar14 < ny) {
      b[lVar17 >> 0x20] =
           (uchar)((int)(*(int *)((long)a + (lVar4 >> 0x1e)) << 3 & uVar12 |
                        *(int *)((long)a + (lVar9 >> 0x1e)) * 2 & uVar15) >> (bVar1 & 0x1f));
      uVar11 = (ulong)((int)uVar11 + (int)lVar13 + 1);
    }
    else {
      uVar11 = (uVar11 & 0xffffffff) + lVar13;
    }
    iVar6 = iVar6 + 2;
    n = n + iVar2;
    iVar5 = iVar5 + iVar2;
  }
  if (iVar6 < nx) {
    lVar4 = lVar3 << 0x20;
    puVar10 = b + lVar16;
    lVar16 = lVar16 << 0x20;
    for (lVar8 = 0; (int)lVar8 < ny + -1; lVar8 = lVar8 + 2) {
      *puVar10 = (uchar)((int)(a[lVar3 + lVar8] << 3 & uVar12 | a[lVar3 + lVar8 + 1] << 2 & uVar7)
                        >> (bVar1 & 0x1f));
      lVar4 = lVar4 + 0x200000000;
      lVar16 = lVar16 + 0x100000000;
      puVar10 = puVar10 + 1;
    }
    if ((int)lVar8 < ny) {
      b[lVar16 >> 0x20] =
           (uchar)((int)(*(int *)((long)a + (lVar4 >> 0x1e)) << 3 & uVar12) >> (bVar1 & 0x1f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit(int a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
int b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = 1<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
/* tried using s00+n directly in the statements, but this had no effect on performance */
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

/*
 this was not any faster..
 
         b[k] = (a[s00]  & b0) ? 
	            (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 15 : 14
                         :  (a[s10+1] & b0) ? 13 : 12
		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 11 : 10
                         :  (a[s10+1] & b0) ?  9 :  8
	          : (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 7 : 6
                         :  (a[s10+1] & b0) ? 5 : 4

		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 3 : 2
                         :  (a[s10+1] & b0) ? 1 : 0;
*/

/*
this alternative way of calculating b[k] was slowwer than the original code
		    if ( a[s00]     & b0)
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 15;
				else
					b[k] = 14;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 13;
				else
					b[k] = 12;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 11;
				else
					b[k] = 10;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 9;
				else
					b[k] = 8;
		    else
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 7;
				else
					b[k] = 6;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 5;
				else
					b[k] = 4;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 3;
				else
					b[k] = 2;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 1;
				else
					b[k] = 0;
*/
			


			b[k] = ( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;

			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = ( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = ( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
}